

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O0

Iterator * __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::upper_bound
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *this,
          int *key)

{
  int key_00;
  double dVar1;
  int *__a;
  int *piVar2;
  int *in_RDX;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *in_RSI;
  int __x;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *in_RDI;
  double dVar3;
  double dVar4;
  int idx;
  data_node_type *leaf;
  double tolerance;
  int bucketID_prediction_rounded;
  data_node_type *leaf_1;
  int bucketID;
  double bucketID_prediction;
  model_node_type *node;
  AlexNode<int,_int> *cur;
  data_node_type *in_stack_ffffffffffffff38;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *this_00;
  int local_54 [4];
  _func_int **pp_Var5;
  
  in_RSI->contraction_threshold_ = (double)((long)in_RSI->contraction_threshold_ + 1);
  key_00 = *in_RDX;
  pp_Var5 = (in_RSI->super_AlexNode<int,_int>)._vptr_AlexNode;
  this_00 = in_RDI;
  if (((ulong)pp_Var5[1] & 1) == 0) {
    do {
      register0x00001200 =
           LinearModel<int>::predict_double((LinearModel<int> *)(pp_Var5 + 2),key_00);
      local_54[2] = (int)register0x00001200;
      local_54[1] = 0;
      __a = std::max<int>(local_54 + 2,local_54 + 1);
      local_54[0] = *(int *)(pp_Var5 + 6) + -1;
      piVar2 = std::min<int>(__a,local_54);
      __x = (int)__a;
      local_54[2] = *piVar2;
      pp_Var5 = *(_func_int ***)(pp_Var5[7] + (long)local_54[2] * 8);
    } while (((ulong)pp_Var5[1] & 1) == 0);
    in_RSI->expansion_threshold_ =
         (double)((long)*(short *)((long)pp_Var5 + 10) + (long)in_RSI->expansion_threshold_);
    dVar1 = stack0xffffffffffffffb8 + 0.5;
    dVar3 = std::numeric_limits<double>::epsilon();
    dVar3 = dVar3 * 10.0 * stack0xffffffffffffffb8;
    dVar4 = stack0xffffffffffffffb8 - (double)(int)dVar1;
    std::abs(__x);
    if (dVar4 <= dVar3) {
      if (stack0xffffffffffffffb8 < (double)(int)dVar1) {
        if (pp_Var5[7] != (_func_int *)0x0) {
          AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
          first_key(this_00);
        }
      }
      else if (pp_Var5[8] != (_func_int *)0x0) {
        AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
        last_key(this_00);
      }
    }
  }
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::find_upper
            (in_RSI,(int *)this_00);
  Iterator::Iterator((Iterator *)in_RDI,in_stack_ffffffffffffff38,0);
  return (Iterator *)this_00;
}

Assistant:

typename self_type::Iterator upper_bound(const T& key) {
    stats_.num_lookups++;
    data_node_type* leaf = get_leaf(key);
    int idx = leaf->find_upper(key);
    return Iterator(leaf, idx);  // automatically handles the case where idx ==
                                 // leaf->data_capacity
  }